

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeAuto
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base,size_t batchSize)

{
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *configs_00;
  string *target_00;
  bool bVar1;
  unsigned_long *puVar2;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  cVar3;
  string local_148;
  cmValue local_128;
  cmValue local_120;
  UnityBatchedSource *local_118;
  UnityBatchedSource *local_110;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  local_108;
  UnitySource local_f8;
  UnityBatchedSource *local_d0;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  end;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  local_c0;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  begin;
  string filename;
  string extension;
  unsigned_long local_68;
  size_t batch;
  size_t chunk;
  size_t itemsLeft;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *local_48;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *filtered_sources_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  cmValue afterInclude_local;
  cmValue beforeInclude_local;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> *unity_files
  ;
  
  afterInclude_local = beforeInclude;
  this_local = (cmLocalGenerator *)afterInclude.Value;
  local_48 = filtered_sources;
  filtered_sources_local =
       (vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
        *)configs;
  configs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  if (batchSize == 0) {
    batchSize = std::
                vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                ::size(filtered_sources);
  }
  itemsLeft._7_1_ = 0;
  std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::vector
            (__return_storage_ptr__);
  chunk = std::
          vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ::size(local_48);
  local_68 = 0;
  for (; chunk != 0; chunk = chunk - batch) {
    puVar2 = std::min<unsigned_long>(&chunk,&batchSize);
    batch = *puVar2;
    std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            configs_local,"C");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)(filename.field_2._M_local_buf + 8),"_c.c");
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              configs_local,"CXX");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(filename.field_2._M_local_buf + 8),"_cxx.cxx");
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )configs_local,"OBJC");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)(filename.field_2._M_local_buf + 8),"_m.m");
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)configs_local,"OBJCXX");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)(filename.field_2._M_local_buf + 8),"_mm.mm");
          }
        }
      }
    }
    cmStrCat<std::__cxx11::string_const&,char_const(&)[7],unsigned_long&,std::__cxx11::string&>
              ((string *)&begin,filename_base,(char (*) [7])0x103fc74,&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&filename.field_2 + 8));
    end._M_current =
         (UnityBatchedSource *)
         std::
         vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
         ::begin(local_48);
    local_c0 = __gnu_cxx::
               __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
               ::operator+(&end,local_68 * batchSize);
    local_118 = (UnityBatchedSource *)
                __gnu_cxx::
                __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                ::operator+(&local_c0,batch);
    target_00 = lang_local;
    configs_00 = filtered_sources_local;
    local_110 = local_c0._M_current;
    local_d0 = local_118;
    cVar3 = cmMakeRange<__gnu_cxx::__normal_iterator<cmLocalGenerator::UnityBatchedSource_const*,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>,__gnu_cxx::__normal_iterator<cmLocalGenerator::UnityBatchedSource_const*,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>>
                      (local_c0,(__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                                 )local_118);
    local_120.Value = afterInclude_local.Value;
    local_128.Value = (string *)this_local;
    local_108 = cVar3;
    std::__cxx11::string::string((string *)&local_148,(string *)&begin);
    WriteUnitySource(&local_f8,this,(cmGeneratorTarget *)target_00,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)configs_00,local_108,local_120,local_128,&local_148);
    std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
    emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,&local_f8);
    UnitySource::~UnitySource(&local_f8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&begin);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    local_68 = local_68 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeAuto(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base, size_t batchSize)
{
  if (batchSize == 0) {
    batchSize = filtered_sources.size();
  }

  std::vector<UnitySource> unity_files;
  for (size_t itemsLeft = filtered_sources.size(), chunk, batch = 0;
       itemsLeft > 0; itemsLeft -= chunk, ++batch) {

    chunk = std::min(itemsLeft, batchSize);

    std::string extension;
    if (lang == "C") {
      extension = "_c.c";
    } else if (lang == "CXX") {
      extension = "_cxx.cxx";
    } else if (lang == "OBJC") {
      extension = "_m.m";
    } else if (lang == "OBJCXX") {
      extension = "_mm.mm";
    }
    std::string filename = cmStrCat(filename_base, "unity_", batch, extension);
    auto const begin = filtered_sources.begin() + batch * batchSize;
    auto const end = begin + chunk;
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(begin, end), beforeInclude, afterInclude,
      std::move(filename)));
  }
  return unity_files;
}